

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<DomCustomWidget*>::emplace<DomCustomWidget*&>
          (QPodArrayOps<DomCustomWidget_*> *this,qsizetype i,DomCustomWidget **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  DomCustomWidget **ppDVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<DomCustomWidget_*> *in_RDI;
  DomCustomWidget **where;
  GrowthPosition pos;
  DomCustomWidget *tmp;
  bool detach;
  QArrayDataPointer<DomCustomWidget_*> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  DomCustomWidget *pDVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<DomCustomWidget_*>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<DomCustomWidget_*>::freeSpaceAtEnd(in_stack_ffffffffffffffc8),
       qVar2 != 0)) {
      ppDVar3 = QArrayDataPointer<DomCustomWidget_*>::end(in_RDI);
      *ppDVar3 = (DomCustomWidget *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<DomCustomWidget_*>::freeSpaceAtBegin(in_stack_ffffffffffffffc8),
       qVar2 != 0)) {
      ppDVar3 = QArrayDataPointer<DomCustomWidget_*>::begin
                          ((QArrayDataPointer<DomCustomWidget_*> *)0x1d7c67);
      ppDVar3[-1] = (DomCustomWidget *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  pDVar5 = (DomCustomWidget *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<DomCustomWidget_*>::detachAndGrow
            ((QArrayDataPointer<DomCustomWidget_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
             (GrowthPosition)((ulong)pDVar5 >> 0x20),CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (DomCustomWidget ***)in_stack_ffffffffffffffc8,in_RDI);
  ppDVar3 = QPodArrayOps<DomCustomWidget_*>::createHole
                      ((QPodArrayOps<DomCustomWidget_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                       (GrowthPosition)((ulong)pDVar5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *ppDVar3 = pDVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }